

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<kj::Array<unsigned_char>_> __thiscall
kj::AsyncInputStream::readAllBytes(AsyncInputStream *this,uint64_t limit)

{
  undefined8 uVar1;
  AllReader *limit_00;
  TransformPromiseNodeBase *pTVar2;
  Disposer *in_RDX;
  AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_> *pAVar3;
  AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_> *extraout_RDX;
  AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_> *extraout_RDX_00;
  Own<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>_>_> OVar4;
  Promise<kj::Array<unsigned_char>_> PVar5;
  Promise<kj::Array<unsigned_char>_> promise;
  undefined1 local_58 [32];
  TransformPromiseNodeBase *local_38;
  Own<kj::(anonymous_namespace)::AllReader> local_30;
  
  limit_00 = (AllReader *)operator_new(0x28);
  limit_00->input = (AsyncInputStream *)limit;
  (limit_00->parts).builder.ptr = (Array<unsigned_char> *)0x0;
  (limit_00->parts).builder.pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
  (limit_00->parts).builder.endPtr = (Array<unsigned_char> *)0x0;
  anon_unknown_77::AllReader::loop((AllReader *)local_58,(uint64_t)limit_00);
  pTVar2 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar2,(Own<kj::_::PromiseNode> *)local_58,
             _::
             TransformPromiseNode<kj::Array<unsigned_char>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++:126:29),_kj::_::PropagateException>
             ::anon_class_16_2_f81c8ca8_for_func::operator());
  uVar1 = local_58._8_8_;
  (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00449c00;
  pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)limit_00;
  pTVar2[1].dependency.disposer = in_RDX;
  local_58._24_8_ =
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Array<unsigned_char>,unsigned_long,kj::(anonymous_namespace)::AllReader::readAllBytes(unsigned_long)::{lambda(unsigned_long)#1},kj::_::PropagateException>>
        ::instance;
  local_38 = pTVar2;
  if ((Array<unsigned_char> *)local_58._8_8_ != (Array<unsigned_char> *)0x0) {
    local_58._8_8_ = (Array<unsigned_char> *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_58._4_4_,local_58._0_4_))
              ((undefined8 *)CONCAT44(local_58._4_4_,local_58._0_4_),
               (long)(uchar **)uVar1 + *(long *)(*(uchar **)uVar1 + -0x10));
  }
  local_30.disposer = (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::AllReader>::instance;
  local_30.ptr = limit_00;
  OVar4 = heap<kj::_::AttachmentPromiseNode<kj::Own<kj::(anonymous_namespace)::AllReader>>,kj::Own<kj::_::PromiseNode>,kj::Own<kj::(anonymous_namespace)::AllReader>>
                    ((kj *)local_58,(Own<kj::_::PromiseNode> *)(local_58 + 0x18),&local_30);
  pAVar3 = OVar4.ptr;
  *(undefined4 *)&this->_vptr_AsyncInputStream = local_58._0_4_;
  *(undefined4 *)((long)&this->_vptr_AsyncInputStream + 4) = local_58._4_4_;
  *(undefined4 *)&this[1]._vptr_AsyncInputStream = local_58._8_4_;
  *(undefined4 *)((long)&this[1]._vptr_AsyncInputStream + 4) = local_58._12_4_;
  if (local_30.ptr != (AllReader *)0x0) {
    (**(local_30.disposer)->_vptr_Disposer)();
    pAVar3 = extraout_RDX;
  }
  pTVar2 = local_38;
  if (local_38 != (TransformPromiseNodeBase *)0x0) {
    local_38 = (TransformPromiseNodeBase *)0x0;
    (**(code **)*(uchar **)local_58._24_8_)
              (local_58._24_8_,
               (pTVar2->super_PromiseNode)._vptr_PromiseNode[-2] +
               (long)&(pTVar2->super_PromiseNode)._vptr_PromiseNode);
    pAVar3 = extraout_RDX_00;
  }
  PVar5.super_PromiseBase.node.ptr = (PromiseNode *)pAVar3;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Array<unsigned_char>_>)PVar5.super_PromiseBase.node;
}

Assistant:

Promise<Array<byte>> AsyncInputStream::readAllBytes(uint64_t limit) {
  auto reader = kj::heap<AllReader>(*this);
  auto promise = reader->readAllBytes(limit);
  return promise.attach(kj::mv(reader));
}